

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

void __thiscall StackSymbol::print(StackSymbol *this)

{
  pointer pdVar1;
  ostream *poVar2;
  pointer piVar3;
  long lVar4;
  ostream *poVar5;
  
  switch(this->type_) {
  case kInt:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Int Value: ",0xb);
    poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(this->value_).int_value);
    break;
  case kIntArray:
    poVar5 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Int Array: ",0xb);
    piVar3 = (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->value_).int_array.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar3) >> 2)) {
      lVar4 = 0;
      poVar5 = (ostream *)&std::cout;
      do {
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,piVar3[lVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        lVar4 = lVar4 + 1;
        piVar3 = (this->value_).int_array.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar4 < (int)((ulong)((long)(this->value_).int_array.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish - (long)piVar3) >> 2));
    }
    break;
  case kReal:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Real Value: ",0xc);
    poVar5 = std::ostream::_M_insert<double>((this->value_).real_value);
    break;
  case kRealArray:
    poVar5 = (ostream *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Real Array: ",0xc);
    pdVar1 = (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->value_).real_array.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)pdVar1) >> 3)) {
      lVar4 = 0;
      poVar5 = (ostream *)&std::cout;
      do {
        poVar2 = std::ostream::_M_insert<double>(pdVar1[lVar4]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        lVar4 = lVar4 + 1;
        pdVar1 = (this->value_).real_array.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (lVar4 < (int)((ulong)((long)(this->value_).real_array.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1)
                            >> 3));
    }
    break;
  default:
    goto switchD_001315bd_default;
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
switchD_001315bd_default:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"===================================",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  return;
}

Assistant:

void StackSymbol::print() const {
    if (type_ == StackSymbol::Type::kInt) {
        std::cout << "Int Value: " << value_.int_value << std::endl;
    } else if (type_ == StackSymbol::Type::kIntArray) {
        std::cout << "Int Array: ";
        for (int i = 0; i < (int)value_.int_array.size(); i++) {
            std::cout << value_.int_array[i] << " ";
        }
        std::cout << std::endl;
    } else if (type_ == StackSymbol::Type::kReal) {
        std::cout << "Real Value: " << value_.real_value << std::endl;
    } else if (type_ == StackSymbol::Type::kRealArray) {
        std::cout << "Real Array: ";
        for (int i = 0; i < (int)value_.real_array.size(); i++) {
            std::cout << value_.real_array[i] << " ";
        }
        std::cout << std::endl;
    }
    std::cout << "===================================" << std::endl;
}